

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZGeoNode_*>::Resize(TPZVec<TPZGeoNode_*> *this,int64_t newsize,TPZGeoNode **object)

{
  TPZGeoNode **ppTVar1;
  TPZGeoNode *pTVar2;
  TPZGeoNode **ppTVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  
  if (-1 < newsize) {
    lVar6 = this->fNElements;
    if (lVar6 != newsize) {
      if (newsize == 0) {
        ppTVar3 = (TPZGeoNode **)0x0;
      }
      else {
        ppTVar3 = (TPZGeoNode **)operator_new__(-(ulong)((ulong)newsize >> 0x3d != 0) | newsize * 8)
        ;
      }
      if (newsize <= lVar6) {
        lVar6 = newsize;
      }
      ppTVar1 = this->fStore;
      lVar5 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar5;
      }
      for (; lVar6 != lVar5; lVar5 = lVar5 + 1) {
        ppTVar3[lVar5] = ppTVar1[lVar5];
      }
      pTVar2 = *object;
      for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
        ppTVar3[lVar6] = pTVar2;
      }
      if (ppTVar1 != (TPZGeoNode **)0x0) {
        operator_delete__(ppTVar1);
      }
      this->fStore = ppTVar3;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}